

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_read_record_layer(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t *psVar8;
  long lVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  size_t __n;
  uchar *puVar14;
  
  uVar2 = ssl->in_hslen;
  if (uVar2 == 0) {
    if (ssl->in_offt != (uchar *)0x0) {
      return 0;
    }
    psVar8 = &ssl->in_msglen;
LAB_00113552:
    *psVar8 = 0;
  }
  else {
    if (ssl->in_offt != (uchar *)0x0) {
      return -0x6c00;
    }
    __n = ssl->in_msglen - uVar2;
    if (ssl->in_msglen < uVar2 || __n == 0) {
      psVar8 = &ssl->in_hslen;
      ssl->in_msglen = 0;
      goto LAB_00113552;
    }
    ssl->in_msglen = __n;
    memmove(ssl->in_msg,ssl->in_msg + uVar2,__n);
    ssl->in_hslen = 0;
    if (ssl->in_msglen != 0) {
      return 0;
    }
  }
  iVar5 = mbedtls_ssl_fetch_input(ssl,(ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
  if (iVar5 != 0) {
    return iVar5;
  }
  pbVar3 = ssl->in_hdr;
  bVar1 = *pbVar3;
  ssl->in_msgtype = (uint)bVar1;
  puVar14 = (uchar *)(ulong)(ushort)(*(ushort *)ssl->in_len << 8 | *(ushort *)ssl->in_len >> 8);
  ssl->in_msglen = (size_t)puVar14;
  uVar7 = *(uint *)&ssl->conf->field_0x174;
  uVar11 = (uint)pbVar3[1];
  if ((uVar7 & 2) != 0) {
    uVar13 = 2;
    if (pbVar3[2] != 0xff) {
      uVar13 = (pbVar3[2] ^ 0xff) + 1;
    }
    iVar5 = -0x7200;
    if ((bVar1 & 0xfffffffc) == 0x14) {
      uVar11 = (byte)~pbVar3[1] + 2;
      goto LAB_00113607;
    }
    goto LAB_001136b7;
  }
  if ((bVar1 & 0xfc) == 0x14) {
    uVar13 = (uint)pbVar3[2];
LAB_00113607:
    if (((uVar11 != ssl->major_ver) || (ssl->conf->max_minor_ver < uVar13)) ||
       (ssl->in_buf + (0x414d - (long)ssl->in_msg) < puVar14)) goto LAB_001136b1;
    if ((uVar7 & 2) == 0) goto LAB_00113649;
    uVar10 = *(ushort *)ssl->in_ctr << 8 | *(ushort *)ssl->in_ctr >> 8;
    if (uVar10 == ssl->in_epoch) {
      iVar6 = mbedtls_ssl_dtls_replay_check(ssl);
      iVar5 = -0x6700;
      if (iVar6 == 0) {
        if (bVar1 == 0x17) {
          if ((ssl->state == 0x10) || ((ssl->state == 2 && (ssl->renego_status == 1))))
          goto LAB_00113649;
        }
        else if ((bVar1 != 0x14) || ((ssl->state == 10 || (ssl->state == 0xc)))) {
LAB_00113649:
          if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
            iVar5 = -0x7200;
            if (puVar14 + -0x4001 < (uchar *)0xffffffffffffc000) goto LAB_001136b7;
          }
          else {
            puVar4 = (uchar *)ssl->transform_in->minlen;
            if (puVar14 < puVar4) goto LAB_001136b1;
            if ((puVar4 + 0x4100 < puVar14) && (iVar5 = -0x7200, 0 < ssl->minor_ver))
            goto LAB_001136b7;
          }
          iVar5 = mbedtls_ssl_fetch_input(ssl,(size_t)(puVar14 + (ulong)(uVar7 & 2) * 4 + 5));
          if (iVar5 != 0) {
            return iVar5;
          }
          if ((ssl->conf->field_0x174 & 2) == 0) {
            lVar9 = 0xe8;
            lVar12 = 0;
          }
          else {
            lVar12 = ssl->in_msglen + 0xd;
            lVar9 = 0xf8;
          }
          *(long *)((long)&ssl->conf + lVar9) = lVar12;
          uVar7 = ssl_prepare_record_content(ssl);
          if (uVar7 == 0) {
            return 0;
          }
          if ((ssl->conf->field_0x174 & 2) == 0) {
LAB_00113829:
            if (uVar7 == 0xffff8e80) {
              ssl->out_msgtype = 0x15;
              ssl->out_msglen = 2;
              *ssl->out_msg = '\x02';
              ssl->out_msg[1] = '\x14';
              mbedtls_ssl_write_record(ssl);
              return -0x7180;
            }
            return uVar7;
          }
          if ((uVar7 | 0x80) != 0xffff8e80) {
            return uVar7;
          }
          if ((ssl->state == 0xd) || (ssl->state == 0xb)) goto LAB_00113829;
          uVar7 = ssl->conf->badmac_limit;
          if ((uVar7 != 0) &&
             (uVar11 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar11, uVar7 <= uVar11)) {
            return -0x7180;
          }
          goto LAB_001138d3;
        }
      }
    }
    else {
      iVar5 = -0x6700;
      if (((((uVar7 & 1) != 0) && (uVar10 == 0)) &&
          ((ssl->state == 0x10 && ((bVar1 == 0x16 && (0xd < ssl->in_left)))))) &&
         (ssl->in_buf[0xd] == '\x01')) {
        iVar5 = ssl_handle_possible_reconnect(ssl);
      }
    }
  }
  else {
    ssl->out_msgtype = 0x15;
    ssl->out_msglen = 2;
    *ssl->out_msg = '\x02';
    ssl->out_msg[1] = '\n';
    mbedtls_ssl_write_record(ssl);
LAB_001136b1:
    iVar5 = -0x7200;
  }
LAB_001136b7:
  if (iVar5 == -0x6780) {
    return -0x6780;
  }
  if ((*(uint *)&ssl->conf->field_0x174 & 2) == 0) {
    return iVar5;
  }
  if (iVar5 == -0x6700) {
    ssl->next_record_offset = ssl->in_msglen + 0xd;
    return -0x6580;
  }
LAB_001138d3:
  ssl->next_record_offset = 0;
  ssl->in_left = 0;
  return -0x6580;
}

Assistant:

int mbedtls_ssl_read_record_layer( mbedtls_ssl_context *ssl )
{
    int ret;

    /*
     * Step A
     *
     * Consume last content-layer message and potentially
     * update in_msglen which keeps track of the contents'
     * consumption state.
     *
     * (1) Handshake messages:
     *     Remove last handshake message, move content
     *     and adapt in_msglen.
     *
     * (2) Alert messages:
     *     Consume whole record content, in_msglen = 0.
     *
     * (3) Change cipher spec:
     *     Consume whole record content, in_msglen = 0.
     *
     * (4) Application data:
     *     Don't do anything - the record layer provides
     *     the application data as a stream transport
     *     and consumes through mbedtls_ssl_read only.
     *
     */

    /* Case (1): Handshake messages */
    if( ssl->in_hslen != 0 )
    {
        /* Hard assertion to be sure that no application data
         * is in flight, as corrupting ssl->in_msglen during
         * ssl->in_offt != NULL is fatal. */
        if( ssl->in_offt != NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Get next Handshake message in the current record
         */

        /* Notes:
         * (1) in_hslen is not necessarily the size of the
         *     current handshake content: If DTLS handshake
         *     fragmentation is used, that's the fragment
         *     size instead. Using the total handshake message
         *     size here is faulty and should be changed at
         *     some point.
         * (2) While it doesn't seem to cause problems, one
         *     has to be very careful not to assume that in_hslen
         *     is always <= in_msglen in a sensible communication.
         *     Again, it's wrong for DTLS handshake fragmentation.
         *     The following check is therefore mandatory, and
         *     should not be treated as a silently corrected assertion.
         *     Additionally, ssl->in_hslen might be arbitrarily out of
         *     bounds after handling a DTLS message with an unexpected
         *     sequence number, see mbedtls_ssl_prepare_handshake_record.
         */
        if( ssl->in_hslen < ssl->in_msglen )
        {
            ssl->in_msglen -= ssl->in_hslen;
            memmove( ssl->in_msg, ssl->in_msg + ssl->in_hslen,
                     ssl->in_msglen );

            MBEDTLS_SSL_DEBUG_BUF( 4, "remaining content in record",
                                   ssl->in_msg, ssl->in_msglen );
        }
        else
        {
            ssl->in_msglen = 0;
        }

        ssl->in_hslen   = 0;
    }
    /* Case (4): Application data */
    else if( ssl->in_offt != NULL )
    {
        return( 0 );
    }
    /* Everything else (CCS & Alerts) */
    else
    {
        ssl->in_msglen = 0;
    }

    /*
     * Step B
     *
     * Fetch and decode new record if current one is fully consumed.
     *
     */

    if( ssl->in_msglen > 0 )
    {
        /* There's something left to be processed in the current record. */
        return( 0 );
    }

    /* Current record either fully processed or to be discarded. */

    if( ( ret = mbedtls_ssl_fetch_input( ssl, mbedtls_ssl_hdr_len( ssl ) ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    if( ( ret = ssl_parse_record_header( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
            ret != MBEDTLS_ERR_SSL_CLIENT_RECONNECT )
        {
            if( ret == MBEDTLS_ERR_SSL_UNEXPECTED_RECORD )
            {
                /* Skip unexpected record (but not whole datagram) */
                ssl->next_record_offset = ssl->in_msglen
                                        + mbedtls_ssl_hdr_len( ssl );

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding unexpected record "
                                            "(header)" ) );
            }
            else
            {
                /* Skip invalid record and the rest of the datagram */
                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record "
                                            "(header)" ) );
            }

            /* Get next record */
            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
#endif
        return( ret );
    }

    /*
     * Read and optionally decrypt the message contents
     */
    if( ( ret = mbedtls_ssl_fetch_input( ssl,
                                 mbedtls_ssl_hdr_len( ssl ) + ssl->in_msglen ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_fetch_input", ret );
        return( ret );
    }

    /* Done reading this record, get ready for the next one */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->next_record_offset = ssl->in_msglen + mbedtls_ssl_hdr_len( ssl );
        if( ssl->next_record_offset < ssl->in_left )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "more than one record within datagram" ) );
        }
    }
    else
#endif
        ssl->in_left = 0;

    if( ( ret = ssl_prepare_record_content( ssl ) ) != 0 )
    {
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Silently discard invalid records */
            if( ret == MBEDTLS_ERR_SSL_INVALID_RECORD ||
                ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                /* Except when waiting for Finished as a bad mac here
                 * probably means something went wrong in the handshake
                 * (eg wrong psk used, mitm downgrade attempt, etc.) */
                if( ssl->state == MBEDTLS_SSL_CLIENT_FINISHED ||
                    ssl->state == MBEDTLS_SSL_SERVER_FINISHED )
                {
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
                    if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
                    {
                        mbedtls_ssl_send_alert_message( ssl,
                                MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
                    }
#endif
                    return( ret );
                }

#if defined(MBEDTLS_SSL_DTLS_BADMAC_LIMIT)
                if( ssl->conf->badmac_limit != 0 &&
                    ++ssl->badmac_seen >= ssl->conf->badmac_limit )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "too many records with bad MAC" ) );
                    return( MBEDTLS_ERR_SSL_INVALID_MAC );
                }
#endif

                /* As above, invalid records cause
                 * dismissal of the whole datagram. */

                ssl->next_record_offset = 0;
                ssl->in_left = 0;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "discarding invalid record (mac)" ) );
                return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
            }

            return( ret );
        }
        else
#endif
        {
            /* Error out (and send alert) on invalid records */
#if defined(MBEDTLS_SSL_ALL_ALERT_MESSAGES)
            if( ret == MBEDTLS_ERR_SSL_INVALID_MAC )
            {
                mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                        MBEDTLS_SSL_ALERT_MSG_BAD_RECORD_MAC );
            }
#endif
            return( ret );
        }
    }

    return( 0 );
}